

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::ValidateShaderResources
          (PipelineStateGLImpl *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pShaderResources
          ,char *ShaderName,SHADER_TYPE ShaderStages)

{
  undefined1 uVar1;
  ShaderResourcesGL *this_00;
  bool bVar2;
  GLResourceAttribs *pGVar3;
  TextureInfo *Attribs;
  ImageInfo *Attribs_00;
  SHADER_RESOURCE_TYPE AltResourceType;
  Uint32 ub;
  uint uVar4;
  char *ShaderName_local;
  SHADER_TYPE ShaderStages_local;
  Uint32 AllowedTypeBits;
  anon_class_24_3_205b5413 HandleResource;
  anon_class_24_3_16b9645b local_50;
  PipelineResourceLayoutDesc *local_38;
  
  HandleResource.ShaderName = &ShaderName_local;
  HandleResource.ShaderStages = &ShaderStages_local;
  this_00 = (pShaderResources->
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_50.pResourceLayout = &local_38;
  local_38 = (PipelineResourceLayoutDesc *)0x0;
  local_50.AllowedTypeBits = &AllowedTypeBits;
  AllowedTypeBits = 0xffffffff;
  ShaderName_local = ShaderName;
  ShaderStages_local = ShaderStages;
  HandleResource.this = this;
  local_50.this = this_00;
  for (uVar4 = 0; uVar4 < this_00->m_NumUniformBuffers; uVar4 = uVar4 + 1) {
    pGVar3 = &ShaderResourcesGL::GetUniformBuffer(this_00,uVar4)->super_GLResourceAttribs;
    bVar2 = ShaderResourcesGL::
            ProcessConstResources<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:706:27),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:710:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:715:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:720:27)>
            ::anon_class_24_3_16b9645b::operator()(&local_50,pGVar3->Name);
    if (bVar2) {
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&HandleResource,pGVar3,pGVar3->ResourceType);
    }
  }
  for (uVar4 = 0; uVar4 < this_00->m_NumTextures; uVar4 = uVar4 + 1) {
    Attribs = ShaderResourcesGL::GetTexture(this_00,uVar4);
    bVar2 = ShaderResourcesGL::
            ProcessConstResources<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:706:27),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:710:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:715:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:720:27)>
            ::anon_class_24_3_16b9645b::operator()
                      (&local_50,(Attribs->super_GLResourceAttribs).Name);
    if (bVar2) {
      uVar1 = (Attribs->super_GLResourceAttribs).ResourceType;
      AltResourceType = SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;
      if (uVar1 != SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
        AltResourceType = uVar1;
      }
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&HandleResource,&Attribs->super_GLResourceAttribs,AltResourceType);
    }
  }
  for (uVar4 = 0; uVar4 < this_00->m_NumImages; uVar4 = uVar4 + 1) {
    Attribs_00 = ShaderResourcesGL::GetImage(this_00,uVar4);
    bVar2 = ShaderResourcesGL::
            ProcessConstResources<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:706:27),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:710:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:715:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:720:27)>
            ::anon_class_24_3_16b9645b::operator()
                      (&local_50,(Attribs_00->super_GLResourceAttribs).Name);
    if (bVar2) {
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&HandleResource,&Attribs_00->super_GLResourceAttribs,
                 (Attribs_00->super_GLResourceAttribs).ResourceType ==
                 SHADER_RESOURCE_TYPE_TEXTURE_UAV ^ SHADER_RESOURCE_TYPE_BUFFER_SRV);
    }
  }
  for (uVar4 = 0; uVar4 < this_00->m_NumStorageBlocks; uVar4 = uVar4 + 1) {
    pGVar3 = &ShaderResourcesGL::GetStorageBlock(this_00,uVar4)->super_GLResourceAttribs;
    bVar2 = ShaderResourcesGL::
            ProcessConstResources<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:706:27),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:710:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:715:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp:720:27)>
            ::anon_class_24_3_16b9645b::operator()(&local_50,pGVar3->Name);
    if (bVar2) {
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&HandleResource,pGVar3,SHADER_RESOURCE_TYPE_BUFFER_SRV);
    }
  }
  std::
  vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
  ::emplace_back<std::shared_ptr<Diligent::ShaderResourcesGL_const>>
            ((vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
              *)&this->m_ShaderResources,pShaderResources);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_ShaderNames,&ShaderName_local);
  return;
}

Assistant:

void PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<const ShaderResourcesGL> pShaderResources, const char* ShaderName, SHADER_TYPE ShaderStages)
{
    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs,
                                    SHADER_RESOURCE_TYPE                        AltResourceType) //
    {
        const auto ResAttribution = GetResourceAttribution(Attribs.Name, ShaderStages);

#ifdef DILIGENT_DEVELOPMENT
        m_ResourceAttibutions.emplace_back(ResAttribution);
#endif

        if (!ResAttribution)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", Attribs.Name,
                                "' that is not present in any pipeline resource signature used to create pipeline state '",
                                m_Desc.Name, "'.");
        }

        const auto* const pSignature = ResAttribution.pSignature;
        VERIFY_EXPR(pSignature != nullptr);

        if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(ResAttribution.ResourceIndex);

            // Shader reflection does not contain read-only flag, so image and storage buffer can be UAV or SRV.
            // Texture SRV is the same as input attachment.
            const auto Type = (AltResourceType == ResDesc.ResourceType ? AltResourceType : Attribs.ResourceType);

            ValidatePipelineResourceCompatibility(ResDesc, Type, Attribs.ResourceFlags, Attribs.ArraySize, ShaderName, pSignature->GetDesc().Name);
        }
        else
        {
            UNEXPECTED("Resource index should be valid");
        }
    };

    const auto HandleUB = [&](const ShaderResourcesGL::UniformBufferInfo& Attribs) {
        HandleResource(Attribs, Attribs.ResourceType);
    };

    const auto HandleTexture = [&](const ShaderResourcesGL::TextureInfo& Attribs) {
        const bool IsTexelBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV);
        HandleResource(Attribs, IsTexelBuffer ? Attribs.ResourceType : SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
    };

    const auto HandleImage = [&](const ShaderResourcesGL::ImageInfo& Attribs) {
        const bool IsImageBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_UAV);
        HandleResource(Attribs, IsImageBuffer ? SHADER_RESOURCE_TYPE_BUFFER_SRV : SHADER_RESOURCE_TYPE_TEXTURE_SRV);
    };

    const auto HandleSB = [&](const ShaderResourcesGL::StorageBlockInfo& Attribs) {
        HandleResource(Attribs, SHADER_RESOURCE_TYPE_BUFFER_SRV);
    };

    pShaderResources->ProcessConstResources(HandleUB, HandleTexture, HandleImage, HandleSB);

#ifdef DILIGENT_DEVELOPMENT
    m_ShaderResources.emplace_back(std::move(pShaderResources));
    m_ShaderNames.emplace_back(ShaderName);
#endif
}